

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifySize.hpp
# Opt level: O2

void njoy::ENDFtk::section::Type<32,_151>::CompactBreitWignerUncertainties::verifySize
               (int NPL,int NRSA)

{
  char *in_RAX;
  undefined8 *puVar1;
  
  if (NPL < 1) {
    tools::Log::error<char_const*>(in_RAX);
  }
  else {
    if (NRSA < 1) {
      tools::Log::error<char_const*>(in_RAX);
      tools::Log::info<char_const*>(in_RAX);
      goto LAB_0012aaaa;
    }
    if (NRSA * 0xc == NPL) {
      return;
    }
    tools::Log::error<char_const*>(in_RAX);
  }
  tools::Log::info<char_const*>(in_RAX);
  tools::Log::info<char_const*,int>("NPL value: {}",NPL);
LAB_0012aaaa:
  tools::Log::info<char_const*,int>("NRSA value: {}",NRSA);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void
verifySize( int NPL, int NRSA ) {

  if ( NPL < 1 ) {

    Log::error( "Encountered empty list" );
    Log::info( "NPL should be larger than zero and equal to 12 * NRSA" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NRSA value: {}", NRSA );
    throw std::exception();
  }

  if ( NRSA < 1 ) {

    Log::error( "Encountered illegal NRSA value" );
    Log::info( "NRSA should be larger than zero" );
    Log::info( "NRSA value: {}", NRSA );
    throw std::exception();
  }

  if ( NPL != 12 * NRSA ) {

    Log::error( "Encountered inconsistent list size" );
    Log::info( "NPL must be equal to 12 * NRSA" );
    Log::info( "NPL value: {}", NPL );
    Log::info( "NRSA value: {}", NRSA );
    throw std::exception();
  }
}